

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refmap.c
# Opt level: O2

int flatcc_refmap_resize(flatcc_refmap_t *refmap,size_t count)

{
  flatcc_refmap_item *__ptr;
  size_t __nmemb;
  flatcc_refmap_item *pfVar1;
  size_t sVar2;
  flatcc_refmap_ref_t *pfVar3;
  bool bVar4;
  
  if (count < refmap->count) {
    count = refmap->count;
  }
  sVar2 = 8;
  do {
    __nmemb = sVar2;
    sVar2 = __nmemb * 2;
  } while (__nmemb * 0xb3 >> 8 <= count);
  sVar2 = refmap->buckets;
  if (sVar2 != __nmemb) {
    __ptr = refmap->table;
    if (__nmemb == 8) {
      refmap->min_table[7].src = (void *)0x0;
      *(undefined8 *)&refmap->min_table[7].ref = 0;
      refmap->min_table[6].src = (void *)0x0;
      *(undefined8 *)&refmap->min_table[6].ref = 0;
      refmap->min_table[5].src = (void *)0x0;
      *(undefined8 *)&refmap->min_table[5].ref = 0;
      refmap->min_table[4].src = (void *)0x0;
      *(undefined8 *)&refmap->min_table[4].ref = 0;
      refmap->min_table[3].src = (void *)0x0;
      *(undefined8 *)&refmap->min_table[3].ref = 0;
      refmap->min_table[2].src = (void *)0x0;
      *(undefined8 *)&refmap->min_table[2].ref = 0;
      refmap->min_table[1].src = (void *)0x0;
      *(undefined8 *)&refmap->min_table[1].ref = 0;
      refmap->min_table[0].src = (void *)0x0;
      *(undefined8 *)&refmap->min_table[0].ref = 0;
      refmap->table = refmap->min_table;
    }
    else {
      pfVar1 = (flatcc_refmap_item *)calloc(__nmemb,0x10);
      refmap->table = pfVar1;
      if (pfVar1 == (flatcc_refmap_item *)0x0) {
        refmap->table = __ptr;
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/refmap.c"
                      ,0x69,"int flatcc_refmap_resize(flatcc_refmap_t *, size_t)");
      }
    }
    refmap->buckets = __nmemb;
    refmap->count = 0;
    pfVar3 = &__ptr->ref;
    while (bVar4 = sVar2 != 0, sVar2 = sVar2 - 1, bVar4) {
      if (((flatcc_refmap_item *)(pfVar3 + -2))->src != (void *)0x0) {
        flatcc_refmap_insert(refmap,((flatcc_refmap_item *)(pfVar3 + -2))->src,*pfVar3);
      }
      pfVar3 = pfVar3 + 4;
    }
    if (__ptr != refmap->min_table && __ptr != (flatcc_refmap_item *)0x0) {
      free(__ptr);
    }
  }
  return 0;
}

Assistant:

int flatcc_refmap_resize(flatcc_refmap_t *refmap, size_t count)
{
    const size_t min_buckets = sizeof(refmap->min_table) / sizeof(refmap->min_table[0]);

    size_t i;
    size_t buckets;
    size_t buckets_old;
    struct flatcc_refmap_item *T_old;

    if (count < refmap->count) {
        count = refmap->count;
    }
    buckets = min_buckets;

    while (_flatcc_refmap_above_load_factor(count, buckets)) {
        buckets *= 2;
    }
    if (refmap->buckets == buckets) {
        return 0;
    }
    T_old = refmap->table;
    buckets_old = refmap->buckets;
    if (buckets == min_buckets) {
        memset(refmap->min_table, 0, sizeof(refmap->min_table));
        refmap->table = refmap->min_table;
    } else {
        refmap->table = _flatcc_refmap_calloc(buckets, sizeof(refmap->table[0]));
        if (refmap->table == 0) {
            refmap->table = T_old;
            FLATCC_ASSERT(0); /* out of memory */
            return -1;
        }
    }
    refmap->buckets = buckets;
    refmap->count = 0;
    for (i = 0; i < buckets_old; ++i) {
        if (T_old[i].src) {
            flatcc_refmap_insert(refmap, T_old[i].src, T_old[i].ref);
        }
    }
    if (T_old && T_old != refmap->min_table) {
        _flatcc_refmap_free(T_old);
    }
    return 0;
}